

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O3

void flux_test::comparisonTest(void)

{
  SystemImpl *this;
  SystemImpl *this_00;
  FlowImpl *pFVar1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  pFVar1 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(pFVar1,(System *)this,(System *)this_00);
  *(undefined ***)pFVar1 = &PTR_execute_00106cb0;
  pFVar1 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(pFVar1,(System *)this,(System *)this_00);
  *(undefined ***)pFVar1 = &PTR_execute_00106cb0;
  return;
}

Assistant:

void flux_test::comparisonTest() {
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *flux1 = new FlowExp(s1, s2);
    auto *flux2 = new FlowExp(s1, s2);

//    assert(flux1 == flux2);
}